

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.h
# Opt level: O1

void __thiscall
cbtDbvt::rayTestInternal
          (cbtDbvt *this,cbtDbvtNode *root,cbtVector3 *rayFrom,cbtVector3 *rayTo,
          cbtVector3 *rayDirectionInverse,uint *signs,cbtScalar lambda_max,cbtVector3 *aabbMin,
          cbtVector3 *aabbMax,cbtAlignedObjectArray<const_cbtDbvtNode_*> *stack,ICollide *policy)

{
  int iVar1;
  cbtDbvtNode *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  cbtDbvtNode **ppcVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  undefined1 local_58 [8];
  float afStack_50 [2];
  undefined1 local_48 [16];
  cbtDbvtNode **local_38;
  
  if (root != (cbtDbvtNode *)0x0) {
    iVar11 = stack->m_size;
    lVar14 = (long)iVar11;
    if ((lVar14 < 0x81) && (iVar11 != 0x80)) {
      if (stack->m_capacity < 0x80) {
        ppcVar9 = (cbtDbvtNode **)cbtAlignedAllocInternal(0x400,0x10);
        iVar12 = stack->m_size;
        if (0 < (long)iVar12) {
          lVar10 = 0;
          do {
            ppcVar9[lVar10] = stack->m_data[lVar10];
            lVar10 = lVar10 + 1;
          } while (iVar12 != lVar10);
        }
        if (stack->m_data != (cbtDbvtNode **)0x0) {
          if (stack->m_ownsMemory == true) {
            cbtAlignedFreeInternal(stack->m_data);
          }
          stack->m_data = (cbtDbvtNode **)0x0;
        }
        stack->m_ownsMemory = true;
        stack->m_data = ppcVar9;
        stack->m_capacity = 0x80;
      }
      if (iVar11 != 0x80) {
        do {
          stack->m_data[lVar14] = (cbtDbvtNode *)0x0;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 0x80);
      }
    }
    stack->m_size = 0x80;
    *stack->m_data = root;
    iVar12 = 1;
    iVar11 = 0x7e;
    do {
      iVar13 = iVar12 + -1;
      pcVar2 = stack->m_data[(long)iVar12 + -1];
      auVar3 = vinsertps_avx(ZEXT416((uint)((pcVar2->volume).mi.m_floats[0] - aabbMax->m_floats[0]))
                             ,ZEXT416((uint)((pcVar2->volume).mi.m_floats[1] - aabbMax->m_floats[1])
                                     ),0x10);
      _local_58 = vinsertps_avx(auVar3,ZEXT416((uint)((pcVar2->volume).mi.m_floats[2] -
                                                     aabbMax->m_floats[2])),0x28);
      auVar3 = vinsertps_avx(ZEXT416((uint)((pcVar2->volume).mx.m_floats[0] - aabbMin->m_floats[0]))
                             ,ZEXT416((uint)((pcVar2->volume).mx.m_floats[1] - aabbMin->m_floats[1])
                                     ),0x10);
      local_48 = vinsertps_avx(auVar3,ZEXT416((uint)((pcVar2->volume).mx.m_floats[2] -
                                                    aabbMin->m_floats[2])),0x28);
      fVar5 = (*(float *)(local_58 + (ulong)*signs * 0x10) - rayFrom->m_floats[0]) *
              rayDirectionInverse->m_floats[0];
      fVar6 = rayDirectionInverse->m_floats[1] *
              (*(float *)(local_58 + (ulong)(1 - signs[1]) * 0x10 + 4) - rayFrom->m_floats[1]);
      if (fVar5 <= fVar6) {
        fVar7 = rayDirectionInverse->m_floats[0] *
                (*(float *)(local_58 + (ulong)(1 - *signs) * 0x10) - rayFrom->m_floats[0]);
        fVar8 = (*(float *)(local_58 + (ulong)signs[1] * 0x10 + 4) - rayFrom->m_floats[1]) *
                rayDirectionInverse->m_floats[1];
        if (fVar8 <= fVar7) {
          auVar3 = vmaxss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar5));
          fVar5 = rayDirectionInverse->m_floats[2] *
                  (*(float *)(local_58 + (ulong)(1 - signs[2]) * 0x10 + 8) - rayFrom->m_floats[2]);
          if (auVar3._0_4_ <= fVar5) {
            auVar4 = vminss_avx(ZEXT416((uint)fVar6),ZEXT416((uint)fVar7));
            fVar6 = (*(float *)(local_58 + (ulong)signs[2] * 0x10 + 8) - rayFrom->m_floats[2]) *
                    rayDirectionInverse->m_floats[2];
            if (((fVar6 <= auVar4._0_4_) &&
                (auVar3 = vmaxss_avx(ZEXT416((uint)fVar6),auVar3), auVar3._0_4_ < lambda_max)) &&
               (auVar3 = vminss_avx(ZEXT416((uint)fVar5),auVar4), 0.0 < auVar3._0_4_)) {
              if ((pcVar2->field_2).childs[1] == (cbtDbvtNode *)0x0) {
                (*policy->_vptr_ICollide[3])(policy,pcVar2);
              }
              else {
                if (iVar11 < iVar13) {
                  iVar13 = stack->m_size;
                  lVar14 = (long)iVar13;
                  iVar11 = iVar13 * 2;
                  if ((iVar13 <= iVar11) && (iVar13 < iVar11)) {
                    if (stack->m_capacity < iVar11) {
                      if (iVar13 == 0) {
                        ppcVar9 = (cbtDbvtNode **)0x0;
                      }
                      else {
                        ppcVar9 = (cbtDbvtNode **)cbtAlignedAllocInternal(lVar14 << 4,0x10);
                      }
                      iVar1 = stack->m_size;
                      if (0 < (long)iVar1) {
                        lVar10 = 0;
                        do {
                          ppcVar9[lVar10] = stack->m_data[lVar10];
                          lVar10 = lVar10 + 1;
                        } while (iVar1 != lVar10);
                      }
                      if (stack->m_data != (cbtDbvtNode **)0x0) {
                        if (stack->m_ownsMemory == true) {
                          local_38 = ppcVar9;
                          cbtAlignedFreeInternal(stack->m_data);
                          ppcVar9 = local_38;
                        }
                        stack->m_data = (cbtDbvtNode **)0x0;
                      }
                      stack->m_ownsMemory = true;
                      stack->m_data = ppcVar9;
                      stack->m_capacity = iVar11;
                    }
                    if (iVar13 < iVar11) {
                      do {
                        stack->m_data[lVar14] = (cbtDbvtNode *)0x0;
                        lVar14 = lVar14 + 1;
                      } while (iVar11 != lVar14);
                    }
                  }
                  stack->m_size = iVar11;
                  iVar11 = iVar11 + -2;
                }
                stack->m_data[(long)iVar12 + -1] = (pcVar2->field_2).childs[0];
                stack->m_data[iVar12] = (pcVar2->field_2).childs[1];
                iVar13 = iVar12 + 1;
              }
            }
          }
        }
      }
      iVar12 = iVar13;
    } while (iVar12 != 0);
  }
  return;
}

Assistant:

DBVT_PREFIX
inline void cbtDbvt::rayTestInternal(const cbtDbvtNode* root,
									const cbtVector3& rayFrom,
									const cbtVector3& rayTo,
									const cbtVector3& rayDirectionInverse,
									unsigned int signs[3],
									cbtScalar lambda_max,
									const cbtVector3& aabbMin,
									const cbtVector3& aabbMax,
									cbtAlignedObjectArray<const cbtDbvtNode*>& stack,
									DBVT_IPOLICY) const
{
	(void)rayTo;
	DBVT_CHECKTYPE
	if (root)
	{
		cbtVector3 resultNormal;

		int depth = 1;
		int treshold = DOUBLE_STACKSIZE - 2;
		stack.resize(DOUBLE_STACKSIZE);
		stack[0] = root;
		cbtVector3 bounds[2];
		do
		{
			const cbtDbvtNode* node = stack[--depth];
			bounds[0] = node->volume.Mins() - aabbMax;
			bounds[1] = node->volume.Maxs() - aabbMin;
			cbtScalar tmin = 1.f, lambda_min = 0.f;
			unsigned int result1 = false;
			result1 = cbtRayAabb2(rayFrom, rayDirectionInverse, signs, bounds, tmin, lambda_min, lambda_max);
			if (result1)
			{
				if (node->isinternal())
				{
					if (depth > treshold)
					{
						stack.resize(stack.size() * 2);
						treshold = stack.size() - 2;
					}
					stack[depth++] = node->childs[0];
					stack[depth++] = node->childs[1];
				}
				else
				{
					policy.Process(node);
				}
			}
		} while (depth);
	}
}